

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::EquidistantDistortion::getProperties(EquidistantDistortion *this,Properties *prop,int id)

{
  int in_stack_000000b4;
  char *in_stack_000000b8;
  double *in_stack_000000c0;
  char *in_stack_000000c8;
  Properties *in_stack_000000d0;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000b8,in_stack_000000b4);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000b8,in_stack_000000b4);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  std::__cxx11::string::~string(local_68);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000b8,in_stack_000000b4);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  std::__cxx11::string::~string(local_88);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000b8,in_stack_000000b4);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

void EquidistantDistortion::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("e1", id).c_str(), ed[0]);
  prop.putValue(getCameraKey("e2", id).c_str(), ed[1]);
  prop.putValue(getCameraKey("e3", id).c_str(), ed[2]);
  prop.putValue(getCameraKey("e4", id).c_str(), ed[3]);
}